

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O3

void Dar_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  byte bVar2;
  int v;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  unsigned_short uVar13;
  ulong uVar14;
  
  __ptr = (unsigned_short *)calloc(0x10000,2);
  uVar14 = 1;
  __ptr_00 = (char *)calloc(0x10000,1);
  __ptr_01 = (char *)calloc(0x10000,1);
  __ptr_02 = (uchar *)calloc(0x10000,1);
  __ptr_03 = Dar_Permutations(4);
  uVar10 = 1;
  do {
    uVar7 = (ulong)__ptr[uVar14];
    if (uVar7 == 0) {
      uVar3 = uVar10 + 1;
      __ptr_02[uVar14] = (uchar)uVar10;
      uVar12 = 0;
      do {
        puVar11 = Dar_TruthPolarize::Signs;
        lVar8 = 0;
        uVar7 = uVar14 & 0xffffffff;
        do {
          if ((uVar12 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
            bVar2 = (byte)(1 << ((byte)lVar8 & 0x1f));
            uVar7 = (ulong)((*puVar11 & (uint)uVar7) >> (bVar2 & 0x1f) |
                           (~*puVar11 & (uint)uVar7) << (bVar2 & 0x1f));
          }
          lVar8 = lVar8 + 1;
          puVar11 = puVar11 + 1;
        } while (lVar8 != 4);
        bVar2 = (byte)uVar12;
        lVar8 = 0;
        do {
          uVar4 = Dar_TruthPermute((uint)uVar7,__ptr_03[lVar8],4,0);
          uVar13 = (unsigned_short)uVar14;
          if ((ulong)__ptr[uVar4] == 0) {
            __ptr[uVar4] = uVar13;
            __ptr_00[uVar4] = bVar2;
            __ptr_01[uVar4] = (char)lVar8;
            __ptr_02[uVar4] = (uchar)uVar10;
            uVar6 = (ulong)(ushort)uVar4 ^ 0xffff;
            __ptr[uVar6] = uVar13;
            __ptr_00[uVar6] = bVar2 | 0x10;
            __ptr_01[uVar6] = (char)lVar8;
            uVar10 = (uint)__ptr_02[uVar14];
            __ptr_02[uVar6] = __ptr_02[uVar14];
          }
          else if (uVar14 != __ptr[uVar4]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                          ,0x155,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x18);
        puVar11 = Dar_TruthPolarize::Signs;
        lVar8 = 0;
        uVar4 = (uint)uVar14 ^ 0xffff;
        do {
          if ((uVar12 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
            bVar9 = (byte)(1 << ((byte)lVar8 & 0x1f));
            uVar4 = (*puVar11 & uVar4) >> (bVar9 & 0x1f) | (~*puVar11 & uVar4) << (bVar9 & 0x1f);
          }
          lVar8 = lVar8 + 1;
          puVar11 = puVar11 + 1;
        } while (lVar8 != 4);
        lVar8 = 0;
        do {
          uVar5 = Dar_TruthPermute(uVar4,__ptr_03[lVar8],4,0);
          if ((ulong)__ptr[uVar5] == 0) {
            __ptr[uVar5] = uVar13;
            __ptr_00[uVar5] = bVar2;
            __ptr_01[uVar5] = (char)lVar8;
            __ptr_02[uVar5] = (uchar)uVar10;
            uVar7 = (ulong)(ushort)uVar5 ^ 0xffff;
            __ptr[uVar7] = uVar13;
            __ptr_00[uVar7] = bVar2 | 0x10;
            __ptr_01[uVar7] = (char)lVar8;
            uVar10 = (uint)__ptr_02[uVar14];
            __ptr_02[uVar7] = __ptr_02[uVar14];
          }
          else if (uVar14 != __ptr[uVar5]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                          ,0x169,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x18);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x10);
    }
    else {
      if (uVar14 <= uVar7) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                      ,0x13c,
                      "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __ptr_02[uVar7];
      __ptr_02[uVar14] = uVar1;
      __ptr_02[uVar14 & 0xffffffff ^ 0xffff] = uVar1;
      uVar3 = uVar10;
    }
    uVar14 = uVar14 + 1;
    uVar10 = uVar3;
  } while (uVar14 != 0x8000);
  lVar8 = 1;
  do {
    if (__ptr_02[lVar8] == '\0') {
      __assert_fail("uMap[uTruth] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                    ,0x16e,
                    "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xffff);
  __ptr_00[0xffff] = '\x10';
  if (uVar3 != 0xde) {
    __assert_fail("nClasses == 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                  ,0x170,
                  "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
  }
  if (__ptr_03 != (char **)0x0) {
    free(__ptr_03);
  }
  if (puCanons == (unsigned_short **)0x0) {
    if (__ptr != (unsigned_short *)0x0) {
      free(__ptr);
    }
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char **)0x0) {
    free(__ptr_00);
  }
  else {
    *puPhases = __ptr_00;
  }
  if (puPerms == (char **)0x0) {
    if (__ptr_01 != (char *)0x0) {
      free(__ptr_01);
    }
  }
  else {
    *puPerms = __ptr_01;
  }
  if (puMap == (uchar **)0x0) {
    free(__ptr_02);
    return;
  }
  *puMap = __ptr_02;
  return;
}

Assistant:

void Dar_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_CALLOC( unsigned short, nFuncs );
    uPhases = ABC_CALLOC( char, nFuncs );
    uPerms  = ABC_CALLOC( char, nFuncs );
    uMap    = ABC_CALLOC( unsigned char, nFuncs );
    pPerms4 = Dar_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Dar_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Dar_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    for ( uTruth = 1; uTruth < 0xffff; uTruth++ )
        assert( uMap[uTruth] != 0 );
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}